

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void ecs_init_system(ecs_world_t *world,ecs_entity_t system,ecs_iter_action_t action,
                    ecs_query_t *query,void *ctx)

{
  ecs_query_t *peVar1;
  _Bool _Var2;
  int32_t iVar3;
  uint uVar4;
  EcsSystem *pEVar5;
  void *pvVar6;
  ecs_on_demand_out_t *peVar7;
  ecs_on_demand_in_t *peVar8;
  undefined8 *puVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  _Bool is_added;
  _Bool local_51;
  ecs_world_t *local_50;
  ecs_entity_t local_48;
  EcsSystem *local_40;
  ecs_query_t *local_38;
  
  _ecs_assert((_Bool)(world->in_progress ^ 1),0x19,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0xe8);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0xe8,
                  "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                 );
  }
  local_51 = false;
  pEVar5 = (EcsSystem *)ecs_get_mut_w_entity(world,system,5,&local_51);
  _ecs_assert(pEVar5 != (EcsSystem *)0x0,0xc,(char *)0x0,"sptr != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0xed);
  if (pEVar5 == (EcsSystem *)0x0) {
    __assert_fail("sptr != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0xed,
                  "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                 );
  }
  if (local_51 == false) {
    _ecs_assert(pEVar5->query == query,2,(char *)0x0,"sptr->query == query",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                ,0xf0);
    if (pEVar5->query != query) {
      __assert_fail("sptr->query == query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                    ,0xf0,
                    "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                   );
    }
  }
  else {
    pEVar5->invoke_count = 0;
    pEVar5->time_spent = 0.0;
    *(undefined8 *)&pEVar5->time_passed = 0;
    pEVar5->status_ctx = (void *)0x0;
    pEVar5->tick_source = 0;
    pEVar5->on_demand = (ecs_on_demand_out_t *)0x0;
    pEVar5->status_action = (ecs_system_status_action_t)0x0;
    pEVar5->query = query;
    pEVar5->entity = system;
    pEVar5->time_spent = 0.0;
  }
  pEVar5->action = action;
  pEVar5->ctx = ctx;
  if ((local_51 & 1U) != 0) {
    iVar3 = ecs_vector_count(query->tables);
    if (iVar3 == 0) {
      ecs_add_entity(world,system,0x105);
    }
    else {
      ecs_system_activate(world,system,true,pEVar5);
    }
    activate_in_columns(world,query,world->on_enable_components,true);
    _Var2 = ecs_sig_check_constraints(world,&query->sig);
    if (!_Var2) {
      ecs_add_entity(world,system,0x104);
    }
    _Var2 = ecs_has_entity(world,system,0x106);
    if (_Var2) {
      peVar1 = pEVar5->query;
      local_50 = world;
      local_48 = system;
      local_40 = pEVar5;
      local_38 = query;
      pvVar6 = _ecs_vector_first((peVar1->sig).columns,0x28,0x10);
      uVar4 = ecs_vector_count((peVar1->sig).columns);
      if ((int)uVar4 < 1) {
        pcVar10 = ecs_get_name(local_50,local_48);
        _ecs_assert(false,0x24,pcVar10,"out_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                    ,0x8d);
LAB_00130e12:
        __assert_fail("out_count != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x8d,"void register_out_columns(ecs_world_t *, ecs_entity_t, EcsSystem *)");
      }
      lVar12 = 0;
      iVar11 = 0;
      do {
        if (*(int *)((long)pvVar6 + lVar12 + 8) == 2) {
          peVar7 = local_40->on_demand;
          if (peVar7 == (ecs_on_demand_out_t *)0x0) {
            peVar7 = (ecs_on_demand_out_t *)(*ecs_os_api.malloc_)(0x10);
            pEVar5 = local_40;
            local_40->on_demand = peVar7;
            _ecs_assert(peVar7 != (ecs_on_demand_out_t *)0x0,0x11,(char *)0x0,
                        "system_data->on_demand != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                        ,0x6f);
            peVar7 = pEVar5->on_demand;
            if (peVar7 == (ecs_on_demand_out_t *)0x0) {
              __assert_fail("system_data->on_demand != ((void*)0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                            ,0x6f,
                            "void register_out_columns(ecs_world_t *, ecs_entity_t, EcsSystem *)");
            }
            peVar7->system = local_48;
            peVar7->count = 0;
          }
          peVar8 = get_in_component((&local_50->on_activate_components)
                                    [*(int *)((long)pvVar6 + lVar12 + 4) == 2],
                                    *(ecs_entity_t *)((long)pvVar6 + lVar12 + 0x10));
          _ecs_assert(true,0xc,(char *)0x0,"in != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x5a);
          peVar7->count = peVar7->count + peVar8->count;
          puVar9 = (undefined8 *)_ecs_vector_add(&peVar8->systems,8,0x10);
          *puVar9 = peVar7;
          iVar11 = iVar11 + 1;
        }
        system = local_48;
        lVar12 = lVar12 + 0x28;
      } while ((ulong)uVar4 * 0x28 != lVar12);
      pcVar10 = ecs_get_name(local_50,local_48);
      _ecs_assert(iVar11 != 0,0x24,pcVar10,"out_count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x8d);
      pEVar5 = local_40;
      if (iVar11 == 0) goto LAB_00130e12;
      _ecs_assert(local_40->on_demand != (ecs_on_demand_out_t *)0x0,0xc,(char *)0x0,
                  "sptr->on_demand != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x118);
      query = local_38;
      world = local_50;
      if (pEVar5->on_demand == (ecs_on_demand_out_t *)0x0) {
        __assert_fail("sptr->on_demand != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x118,
                      "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                     );
      }
      if (pEVar5->on_demand->count == 0) {
        ecs_add_entity(local_50,system,0x104);
      }
    }
    ecs_vector_count((query->sig).columns);
    _ecs_vector_first((query->sig).columns,0x28,0x10);
  }
  pcVar10 = ecs_get_name(world,system);
  _ecs_trace(1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
             ,0x12e,"system #[green]%s#[reset] created with #[red]%s",pcVar10,(query->sig).expr);
  return;
}

Assistant:

static
void ecs_init_system(
    ecs_world_t *world,
    ecs_entity_t system,
    ecs_iter_action_t action,
    ecs_query_t *query,
    void *ctx)
{
    ecs_assert(!world->in_progress, ECS_INVALID_WHILE_ITERATING, NULL);

    /* Add & initialize the EcsSystem component */
    bool is_added = false;
    EcsSystem *sptr = ecs_get_mut(world, system, EcsSystem, &is_added);
    ecs_assert(sptr != NULL, ECS_INTERNAL_ERROR, NULL);

    if (!is_added) {
        ecs_assert(sptr->query == query, ECS_INVALID_PARAMETER, NULL);
    } else {
        memset(sptr, 0, sizeof(EcsSystem));
        sptr->query = query;
        sptr->entity = system;
        sptr->tick_source = 0;
        sptr->time_spent = 0;
    }

    /* Sanity check to make sure creating the query didn't add any additional
     * tags or components to the system */
    sptr->action = action;
    sptr->ctx = ctx;

    /* Only run this code when the system is created for the first time */
    if (is_added) {
        /* If tables have been matched with this system it is active, and we
         * should activate the in-columns, if any. This will ensure that any
         * OnDemand systems get enabled. */
        if (ecs_vector_count(query->tables)) {
            ecs_system_activate(world, system, true, sptr);
        } else {
            /* If system isn't matched with any tables, mark it as inactive. This
             * causes it to be ignored by the main loop. When the system matches
             * with a table it will be activated. */
            ecs_add_entity(world, system, EcsInactive);
        }

        /* If system is enabled, trigger enable components */
        activate_in_columns(world, query, world->on_enable_components, true);

        /* Check if all non-table column constraints are met. If not, disable
         * system (system will be enabled once constraints are met) */
        if (!ecs_sig_check_constraints(world, &query->sig)) {
            ecs_add_entity(world, system, EcsDisabledIntern);
        }

        /* If the query has a OnDemand system tag, register its [out] columns */
        if (ecs_has_entity(world, system, EcsOnDemand)) {
            register_out_columns(world, system, sptr);
            ecs_assert(sptr->on_demand != NULL, ECS_INTERNAL_ERROR, NULL);

            /* If there are no systems currently interested in any of the [out]
             * columns of the on demand system, disable it */
            if (!sptr->on_demand->count) {
                ecs_add_entity(world, system, EcsDisabledIntern);
            }        
        }

        /* Check if system has out columns */
        int32_t i, count = ecs_vector_count(query->sig.columns);
        ecs_sig_column_t *columns = ecs_vector_first(
                query->sig.columns, ecs_sig_column_t);
        
        for (i = 0; i < count; i ++) {
            if (columns[i].inout_kind != EcsIn) {
                break;
            }
        }
    }

    ecs_trace_1("system #[green]%s#[reset] created with #[red]%s", 
        ecs_get_name(world, system), query->sig.expr);
}